

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O2

Span<const_char> script::Expr(Span<const_char> *sp)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  int iVar7;
  long in_FS_OFFSET;
  Span<const_char> SVar8;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = sp->m_data;
  sVar4 = sp->m_size;
  iVar7 = 0;
  for (sVar6 = 0; sVar5 = sVar4, sVar4 != sVar6; sVar6 = sVar6 + 1) {
    cVar1 = pcVar3[sVar6];
    if ((cVar1 == '{') || (cVar1 == '(')) {
      iVar7 = iVar7 + 1;
    }
    else if (iVar7 == 0) {
      sVar5 = sVar6;
      if (((cVar1 == ')') || (cVar1 == ',')) || (iVar7 = 0, cVar1 == '}')) break;
    }
    else if ((cVar1 == '}') || (cVar1 == ')')) {
      iVar7 = iVar7 + -1;
    }
  }
  SVar8.m_size = (long)(pcVar3 + sVar5) - (long)pcVar3;
  sp->m_data = pcVar3 + sVar5;
  sp->m_size = sVar4 - SVar8.m_size;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  SVar8.m_data = pcVar3;
  return SVar8;
}

Assistant:

Span<const char> Expr(Span<const char>& sp)
{
    int level = 0;
    auto it = sp.begin();
    while (it != sp.end()) {
        if (*it == '(' || *it == '{') {
            ++level;
        } else if (level && (*it == ')' || *it == '}')) {
            --level;
        } else if (level == 0 && (*it == ')' || *it == '}' || *it == ',')) {
            break;
        }
        ++it;
    }
    Span<const char> ret = sp.first(it - sp.begin());
    sp = sp.subspan(it - sp.begin());
    return ret;
}